

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void minverse(double *A,int N,int *ipiv,double *inv)

{
  double *b;
  double *x_00;
  double *x;
  double *col;
  int local_30;
  int stride;
  int j;
  int i;
  double *inv_local;
  int *ipiv_local;
  int N_local;
  double *A_local;
  
  b = (double *)malloc((long)N << 3);
  x_00 = (double *)malloc((long)N << 3);
  for (stride = 0; stride < N; stride = stride + 1) {
    b[stride] = 0.0;
    x_00[stride] = 0.0;
  }
  for (stride = 0; stride < N; stride = stride + 1) {
    b[stride] = 1.0;
    linsolve(A,N,b,ipiv,x_00);
    col._4_4_ = stride;
    for (local_30 = 0; local_30 < N; local_30 = local_30 + 1) {
      inv[col._4_4_] = x_00[local_30];
      col._4_4_ = N + col._4_4_;
    }
    b[stride] = 0.0;
  }
  free(x_00);
  free(b);
  return;
}

Assistant:

void minverse(double *A,int N,int *ipiv,double *inv) {
	int i,j,stride;
	double *col,*x;
	
	col = (double*) malloc(sizeof(double) * N);
	x = (double*) malloc(sizeof(double) * N);
	
	for (i = 0; i < N; ++i) {
		col[i] = 0.;
		x[i] = 0.;
	}
	
	for (i = 0; i < N; ++i) {
		col[i] = 1.;
		linsolve(A,N,col,ipiv,x);
		stride = i;
		for(j = 0; j < N;++j) {
			inv[stride] = x[j];
			stride+= N;
		}
		col[i] = 0.;
	}
		
	free(x);
	free(col);
}